

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtCountOnesInCofsFast(word *pTruth,int nVars,int *pStore)

{
  int iVar1;
  
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 3) {
    __assert_fail("nVars >= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                  ,0x233,"int Abc_TtCountOnesInCofsFast(word *, int, int *)");
  }
  if ((uint)nVars < 7) {
    iVar1 = Abc_TtCountOnesInCofsFast6_rec(*pTruth,nVars + -1,1 << ((char)nVars - 3U & 0x1f),pStore)
    ;
    return iVar1;
  }
  iVar1 = Abc_TtCountOnesInCofsFast_rec(pTruth,nVars + -1,1 << ((char)nVars - 6U & 0x1f),pStore);
  return iVar1;
}

Assistant:

int Abc_TtCountOnesInCofsFast( word * pTruth, int nVars, int * pStore )
{
    memset( pStore, 0, sizeof(int) * nVars );
    assert( nVars >= 3 );
    if ( nVars <= 6 )
        return Abc_TtCountOnesInCofsFast6_rec( pTruth[0], nVars - 1, Abc_TtByteNum( nVars ), pStore );
    else
        return Abc_TtCountOnesInCofsFast_rec( pTruth, nVars - 1, Abc_TtWordNum( nVars ), pStore );
}